

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

IRNode * __thiscall kratos::SwitchStmt::get_child(SwitchStmt *this,uint64_t index)

{
  IRNode *pIVar1;
  long lVar2;
  undefined1 auVar3 [8];
  pointer ppVar4;
  IRNode **ppIVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  ulong uVar8;
  element_type *peVar9;
  IRNode **ppIVar10;
  pointer ppVar11;
  __normal_iterator<std::pair<unsigned_long,_kratos::IRNode_*>_*,_std::vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>_>
  __i;
  long lVar12;
  pointer ppVar13;
  _Rb_tree_header *p_Var14;
  IRNode **ppIVar15;
  pair<unsigned_long,_kratos::ScopedStmtBlock_*> local_58;
  undefined1 auStack_48 [8];
  vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
  cases;
  
  if (index == 0) {
    peVar9 = (this->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    cases.
    super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cases.
    super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ::reserve((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
               *)auStack_48,(this->body_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var6 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(this->body_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var14) {
      do {
        if (*(long *)(p_Var6 + 1) == 0) {
          local_58.first = 0xffffffffffffffff;
        }
        else {
          local_58.first = *(unsigned_long *)(*(long *)(p_Var6 + 1) + 0x270);
        }
        local_58.second = (ScopedStmtBlock *)p_Var6[1]._M_left;
        std::
        vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>
        ::emplace_back<std::pair<unsigned_long,kratos::ScopedStmtBlock*>>
                  ((vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>
                    *)auStack_48,&local_58);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var14);
    }
    ppVar4 = cases.
             super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar3 = auStack_48;
    if (auStack_48 !=
        (undefined1  [8])
        cases.
        super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar12 = (long)cases.
                     super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
      uVar7 = lVar12 >> 4;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,kratos::IRNode*>*,std::vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SwitchStmt::get_child(unsigned_long)::__0>>
                (auStack_48,
                 cases.
                 super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,kratos::IRNode*>*,std::vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SwitchStmt::get_child(unsigned_long)::__0>>
                  (auVar3,ppVar4);
      }
      else {
        ppVar13 = (pointer)((long)auVar3 + 0x100);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,kratos::IRNode*>*,std::vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SwitchStmt::get_child(unsigned_long)::__0>>
                  (auVar3,ppVar13);
        if (ppVar13 != ppVar4) {
          ppIVar15 = &((pointer)((long)auVar3 + 0x100))->second;
          do {
            uVar8 = ppVar13[-1].first;
            uVar7 = ppVar13->first;
            pIVar1 = ppVar13->second;
            ppVar11 = ppVar13;
            ppIVar5 = ppIVar15;
            if (uVar7 < uVar8) {
              do {
                ppIVar10 = ppIVar5;
                ((pair<unsigned_long,_kratos::IRNode_*> *)(ppIVar10 + -1))->first = uVar8;
                uVar8 = (ulong)ppIVar10[-5];
                *ppIVar10 = ppIVar10[-2];
                ppIVar5 = ppIVar10 + -2;
              } while (uVar7 < uVar8);
              ppVar11 = (pointer)(ppIVar10 + -3);
            }
            ppVar11->first = uVar7;
            ppVar11->second = pIVar1;
            ppVar13 = ppVar13 + 1;
            ppIVar15 = ppIVar15 + 2;
          } while (ppVar13 != ppVar4);
        }
      }
    }
    if (index - 1 <
        (ulong)((long)cases.
                      super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 4)) {
      peVar9 = (element_type *)((pointer)((long)auStack_48 + (index - 1) * 0x10))->second;
    }
    else {
      peVar9 = (element_type *)0x0;
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      (long)cases.
                            super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
    }
  }
  return &peVar9->super_IRNode;
}

Assistant:

IRNode *SwitchStmt::get_child(uint64_t index) {
    if (index == 0) {
        return target_.get();
    } else {
        // need to make it deterministic
        index--;
        std::vector<std::pair<uint64_t, IRNode *>> cases;
        cases.reserve(body_.size());
        for (auto const &iter : body_) {
            cases.emplace_back(std::make_pair(
                iter.first ? iter.first->value() : std::numeric_limits<uint64_t>::max(),
                iter.second.get()));
        }
        std::sort(cases.begin(), cases.end(),
                  [](auto const &a, auto const &b) { return a.first < b.first; });
        if (index < cases.size()) {
            return cases[index].second;
        }
        return nullptr;
    }
}